

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

GLchar * __thiscall
gl4cts::GLSL420Pack::TestBase::getStageSpecificLayout(TestBase *this,SHADER_STAGES stage)

{
  if (stage - TESS_CTRL_SHADER < 3) {
    return (&PTR_anon_var_dwarf_5aee24_020dcc40)[stage - TESS_CTRL_SHADER];
  }
  return glcts::fixed_sample_locations_values + 1;
}

Assistant:

const GLchar* TestBase::getStageSpecificLayout(Utils::SHADER_STAGES stage) const
{
	static const GLchar* stage_layout_geometry = "layout(points)                           in;\n"
												 "layout(triangle_strip, max_vertices = 4) out;\n";
	static const GLchar* stage_layout_tess_ctrl = "layout(vertices = 1)                     out;\n";
	static const GLchar* stage_layout_tess_eval = "layout(isolines, point_mode)             in;\n";

	const GLchar* result = "";

	switch (stage)
	{
	case Utils::GEOMETRY_SHADER:
		result = stage_layout_geometry;
		break;
	case Utils::TESS_CTRL_SHADER:
		result = stage_layout_tess_ctrl;
		break;
	case Utils::TESS_EVAL_SHADER:
		result = stage_layout_tess_eval;
		break;
	case Utils::VERTEX_SHADER:
	case Utils::FRAGMENT_SHADER:
	default:
		break;
	}

	return result;
}